

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInfoLogQueryShared.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::verifyInfoLogQuery
          (Functional *this,ResultCollector *result,CallLogWrapper *gl,int logLen,GLuint object,
          offset_in_CallLogWrapper_to_subr getInfoLog,char *getterName)

{
  int iVar1;
  deBool dVar2;
  TestLog *pTVar3;
  undefined1 *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  long *plVar9;
  undefined4 in_register_00000084;
  Enum<int,_2UL> EVar10;
  TestLog *local_d10;
  TestLog *local_c58;
  TestLog *local_ba0;
  TestLog *local_a98;
  TestLog *local_9d8;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  GetNameFunc local_908;
  int local_900;
  GetNameFunc local_8f8;
  int local_8f0;
  string local_8e8;
  allocator<char> local_8c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  GLenum local_83c;
  int local_838;
  deUint32 err_4;
  int written_3;
  string buf_4;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  ScopedLogSection local_7c0;
  ScopedLogSection section_4;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  GetNameFunc local_740;
  int local_738;
  GetNameFunc local_730;
  int local_728;
  string local_720;
  allocator<char> local_6f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  GLenum local_674;
  int local_670;
  deUint32 err_3;
  int written_2;
  string buf_3;
  string local_640;
  allocator<char> local_619;
  string local_618;
  ScopedLogSection local_5f8;
  ScopedLogSection section_3;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  GetNameFunc local_578;
  int local_570;
  GetNameFunc local_568;
  int local_560;
  string local_558;
  allocator<char> local_531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  GLenum local_4ac;
  int local_4a8;
  deUint32 err_2;
  int written_1;
  string buf_2;
  string local_478;
  allocator<char> local_451;
  string local_450;
  ScopedLogSection local_430;
  ScopedLogSection section_2;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  GetNameFunc local_338;
  int local_330;
  GetNameFunc local_328;
  int local_320;
  string local_318;
  allocator<char> local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  GLenum local_26c;
  int local_268;
  deUint32 err_1;
  int written;
  string buf_1;
  string local_238;
  allocator<char> local_211;
  string local_210;
  ScopedLogSection local_1f0;
  ScopedLogSection section_1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  GetNameFunc local_198;
  int local_190;
  GetNameFunc local_188;
  int local_180;
  string local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  GLenum local_d0;
  allocator<char> local_c9;
  deUint32 err;
  string buf;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  ScopedLogSection local_48;
  ScopedLogSection section;
  offset_in_CallLogWrapper_to_subr getInfoLog_local;
  GLuint object_local;
  int logLen_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  section.m_log = (TestLog *)CONCAT44(in_register_00000084,object);
  iVar8 = (int)gl;
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"QueryAll",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Query all",(allocator<char> *)(buf.field_2._M_local_buf + 0xf));
  tcu::ScopedLogSection::ScopedLogSection(&local_48,pTVar3,&local_68,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(buf.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&err,(long)(iVar8 + 2),'X',&local_c9)
  ;
  std::allocator<char>::~allocator(&local_c9);
  puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&err);
  *puVar4 = 0;
  plVar9 = (long *)((long)&result->m_log + getInfoLog);
  if (((ulong)section.m_log & 1) == 0) {
    local_9d8 = section.m_log;
  }
  else {
    local_9d8 = *(TestLog **)((long)section.m_log + *plVar9 + -1);
  }
  uVar5 = std::__cxx11::string::operator[]((ulong)&err);
  (*(code *)local_9d8)(plVar9,logLen,(ulong)gl & 0xffffffff,0,uVar5);
  do {
    local_d0 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
    if (local_d0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Got Error ",&local_151);
      EVar10 = glu::getErrorStr(local_d0);
      local_198 = EVar10.m_getName;
      local_190 = EVar10.m_value;
      local_188 = local_198;
      local_180 = local_190;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_178,&local_188);
      std::operator+(&local_130,&local_150,&local_178);
      std::operator+(&local_110,&local_130,": ");
      std::operator+(&local_f0,&local_110,getterName);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if ((iVar8 < 1) ||
     (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&err), *pcVar6 == '\0')) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&err);
    if ((*pcVar6 != 'X') &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&err), *pcVar6 != '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,
                 "Buffer end guard modified, query wrote over the end of the buffer.",
                 (allocator<char> *)((long)&section_1.m_log + 7));
      tcu::ResultCollector::fail((ResultCollector *)this,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,
               "Return buffer was not INFO_LOG_LENGTH sized and null-terminated",&local_1b9);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
  }
  std::__cxx11::string::~string((string *)&err);
  tcu::ScopedLogSection::~ScopedLogSection(&local_48);
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"QueryMore",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Query more",(allocator<char> *)(buf_1.field_2._M_local_buf + 0xf)
            );
  tcu::ScopedLogSection::ScopedLogSection(&local_1f0,pTVar3,&local_210,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)(buf_1.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&written,(long)(iVar8 + 4),'X',(allocator<char> *)((long)&err_1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&err_1 + 3));
  local_268 = -1;
  puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&written);
  *puVar4 = 0;
  plVar9 = (long *)((long)&result->m_log + getInfoLog);
  if (((ulong)section.m_log & 1) == 0) {
    local_a98 = section.m_log;
  }
  else {
    local_a98 = *(TestLog **)((long)section.m_log + *plVar9 + -1);
  }
  uVar5 = std::__cxx11::string::operator[]((ulong)&written);
  (*(code *)local_a98)(plVar9,logLen,iVar8 + 2,&local_268,uVar5);
  do {
    local_26c = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
    if (local_26c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"Got Error ",&local_2f1);
      EVar10 = glu::getErrorStr(local_26c);
      local_338 = EVar10.m_getName;
      local_330 = EVar10.m_value;
      local_328 = local_338;
      local_320 = local_330;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_318,&local_328);
      std::operator+(&local_2d0,&local_2f0,&local_318);
      std::operator+(&local_2b0,&local_2d0,": ");
      std::operator+(&local_290,&local_2b0,getterName);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (local_268 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"\'length\' was not written to",&local_359);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
  }
  else {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written);
    if (*pcVar6 == '\0') {
      if ((iVar8 == 0) || (local_268 + 1 <= iVar8)) {
        if (local_268 + 1 < iVar8) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"\'length\' is not consistent with INFO_LOG_LENGTH",
                     &local_3d1);
          tcu::ResultCollector::fail((ResultCollector *)this,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written);
          if ((*pcVar6 == 'X') ||
             (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written), *pcVar6 == '\0'))
          {
            iVar1 = local_268;
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written);
            sVar7 = strlen(pcVar6);
            if (iVar1 != (int)sVar7) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_420,"\'length\' and written string length do not match",
                         (allocator<char> *)((long)&section_2.m_log + 7));
              tcu::ResultCollector::fail((ResultCollector *)this,&local_420);
              std::__cxx11::string::~string((string *)&local_420);
              std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f8,
                       "Buffer end guard modified, query wrote over the end of the buffer.",
                       &local_3f9);
            tcu::ResultCollector::fail((ResultCollector *)this,&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::allocator<char>::~allocator(&local_3f9);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,
                   "\'length\' characters + null terminator is larger than INFO_LOG_LENGTH",
                   &local_3a9);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,
                 "Either length was incorrect or result was not null-terminated",&local_381);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
    }
  }
  std::__cxx11::string::~string((string *)&written);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
  if (2 < iVar8) {
    pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"QueryLess",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"Query less",
               (allocator<char> *)(buf_2.field_2._M_local_buf + 0xf));
    tcu::ScopedLogSection::ScopedLogSection(&local_430,pTVar3,&local_450,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)(buf_2.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&written_1,(long)(iVar8 + 2),'X',(allocator<char> *)((long)&err_2 + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&err_2 + 3));
    local_4a8 = -1;
    plVar9 = (long *)((long)&result->m_log + getInfoLog);
    if (((ulong)section.m_log & 1) == 0) {
      local_ba0 = section.m_log;
    }
    else {
      local_ba0 = *(TestLog **)((long)section.m_log + *plVar9 + -1);
    }
    uVar5 = std::__cxx11::string::operator[]((ulong)&written_1);
    (*(code *)local_ba0)(plVar9,logLen,2,&local_4a8,uVar5);
    do {
      local_4ac = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
      if (local_4ac != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"Got Error ",&local_531);
        EVar10 = glu::getErrorStr(local_4ac);
        local_578 = EVar10.m_getName;
        local_570 = EVar10.m_value;
        local_568 = local_578;
        local_560 = local_570;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_558,&local_568);
        std::operator+(&local_510,&local_530,&local_558);
        std::operator+(&local_4f0,&local_510,": ");
        std::operator+(&local_4d0,&local_4f0,getterName);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_530);
        std::allocator<char>::~allocator(&local_531);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (local_4a8 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_598,"\'length\' was not written to",&local_599);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator(&local_599);
    }
    else if (local_4a8 == 1) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written_1);
      if (*pcVar6 != '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5e8,"Expected null terminator at index 1",
                   (allocator<char> *)((long)&section_3.m_log + 7));
        tcu::ResultCollector::fail((ResultCollector *)this,&local_5e8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c0,"Expected \'length\' = 1",&local_5c1);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
    }
    std::__cxx11::string::~string((string *)&written_1);
    tcu::ScopedLogSection::~ScopedLogSection(&local_430);
  }
  if (0 < iVar8) {
    pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"QueryOne",&local_619);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"Query one character",
               (allocator<char> *)(buf_3.field_2._M_local_buf + 0xf));
    tcu::ScopedLogSection::ScopedLogSection(&local_5f8,pTVar3,&local_618,&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)(buf_3.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_618);
    std::allocator<char>::~allocator(&local_619);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&written_2,(long)(iVar8 + 2),'X',(allocator<char> *)((long)&err_3 + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&err_3 + 3));
    local_670 = -1;
    plVar9 = (long *)((long)&result->m_log + getInfoLog);
    if (((ulong)section.m_log & 1) == 0) {
      local_c58 = section.m_log;
    }
    else {
      local_c58 = *(TestLog **)((long)section.m_log + *plVar9 + -1);
    }
    uVar5 = std::__cxx11::string::operator[]((ulong)&written_2);
    (*(code *)local_c58)(plVar9,logLen,1,&local_670,uVar5);
    do {
      local_674 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
      if (local_674 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f8,"Got Error ",&local_6f9);
        EVar10 = glu::getErrorStr(local_674);
        local_740 = EVar10.m_getName;
        local_738 = EVar10.m_value;
        local_730 = local_740;
        local_728 = local_738;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_720,&local_730);
        std::operator+(&local_6d8,&local_6f8,&local_720);
        std::operator+(&local_6b8,&local_6d8,": ");
        std::operator+(&local_698,&local_6b8,getterName);
        tcu::ResultCollector::fail((ResultCollector *)this,&local_698);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_720);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::allocator<char>::~allocator(&local_6f9);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (local_670 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_760,"\'length\' was not written to",&local_761);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_760);
      std::__cxx11::string::~string((string *)&local_760);
      std::allocator<char>::~allocator(&local_761);
    }
    else if (local_670 == 0) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written_2);
      if (*pcVar6 != '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b0,"Expected null terminator at index 0",
                   (allocator<char> *)((long)&section_4.m_log + 7));
        tcu::ResultCollector::fail((ResultCollector *)this,&local_7b0);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_4.m_log + 7));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_788,"Expected \'length\' = 0",&local_789);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_788);
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator(&local_789);
    }
    std::__cxx11::string::~string((string *)&written_2);
    tcu::ScopedLogSection::~ScopedLogSection(&local_5f8);
  }
  pTVar3 = glu::CallLogWrapper::getLog((CallLogWrapper *)result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"QueryNone",&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"Query to zero-sized buffer",
             (allocator<char> *)(buf_4.field_2._M_local_buf + 0xf));
  tcu::ScopedLogSection::ScopedLogSection(&local_7c0,pTVar3,&local_7e0,&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator((allocator<char> *)(buf_4.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&written_3,(long)(iVar8 + 2),'X',(allocator<char> *)((long)&err_4 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&err_4 + 3));
  local_838 = -1;
  plVar9 = (long *)((long)&result->m_log + getInfoLog);
  if (((ulong)section.m_log & 1) == 0) {
    local_d10 = section.m_log;
  }
  else {
    local_d10 = *(TestLog **)((long)section.m_log + *plVar9 + -1);
  }
  uVar5 = std::__cxx11::string::operator[]((ulong)&written_3);
  (*(code *)local_d10)(plVar9,logLen,0,&local_838,uVar5);
  do {
    local_83c = glu::CallLogWrapper::glGetError((CallLogWrapper *)result);
    if (local_83c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"Got Error ",&local_8c1);
      EVar10 = glu::getErrorStr(local_83c);
      local_908 = EVar10.m_getName;
      local_900 = EVar10.m_value;
      local_8f8 = local_908;
      local_8f0 = local_900;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_8e8,&local_8f8);
      std::operator+(&local_8a0,&local_8c0,&local_8e8);
      std::operator+(&local_880,&local_8a0,": ");
      std::operator+(&local_860,&local_880,getterName);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_860);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::allocator<char>::~allocator(&local_8c1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (local_838 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_928,"\'length\' was not written to",&local_929);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_928);
    std::__cxx11::string::~string((string *)&local_928);
    std::allocator<char>::~allocator(&local_929);
  }
  else if (local_838 == 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&written_3);
    if (*pcVar6 != 'X') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_978,"Unexpected buffer mutation at index 0",&local_979);
      tcu::ResultCollector::fail((ResultCollector *)this,&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      std::allocator<char>::~allocator(&local_979);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"Expected \'length\' = 0",&local_951);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::allocator<char>::~allocator(&local_951);
  }
  std::__cxx11::string::~string((string *)&written_3);
  tcu::ScopedLogSection::~ScopedLogSection(&local_7c0);
  return;
}

Assistant:

void verifyInfoLogQuery (tcu::ResultCollector&			result,
						 glu::CallLogWrapper&			gl,
						 int							logLen,
						 glw::GLuint					object,
						 void (glu::CallLogWrapper::*	getInfoLog)(glw::GLuint, glw::GLsizei, glw::GLsizei*, glw::GLchar*),
						 const char*					getterName)
{
	{
		const tcu::ScopedLogSection	section	(gl.getLog(), "QueryAll", "Query all");
		std::string					buf		(logLen + 2, 'X');

		buf[logLen + 1] = '\0';
		(gl.*getInfoLog)(object, logLen, DE_NULL, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (logLen > 0 && buf[logLen-1] != '\0')
			result.fail("Return buffer was not INFO_LOG_LENGTH sized and null-terminated");
		else if (buf[logLen] != 'X' && buf[logLen+1] != '\0')
			result.fail("Buffer end guard modified, query wrote over the end of the buffer.");
	}

	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryMore", "Query more");
		std::string					buf		(logLen + 4, 'X');
		int							written	= -1;

		buf[logLen + 3] = '\0';
		(gl.*getInfoLog)(object, logLen+2, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (buf[written] != '\0')
			result.fail("Either length was incorrect or result was not null-terminated");
		else if (logLen != 0 && (written + 1) > logLen)
			result.fail("'length' characters + null terminator is larger than INFO_LOG_LENGTH");
		else if ((written + 1) < logLen)
			result.fail("'length' is not consistent with INFO_LOG_LENGTH");
		else if (buf[logLen+2] != 'X' && buf[logLen+3] != '\0')
			result.fail("Buffer end guard modified, query wrote over the end of the buffer.");
		else if (written != (int)strlen(&buf[0]))
			result.fail("'length' and written string length do not match");
	}

	if (logLen > 2)
	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryLess", "Query less");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 2, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 1)
			result.fail("Expected 'length' = 1");
		else if (buf[1] != '\0')
			result.fail("Expected null terminator at index 1");
	}

	if (logLen > 0)
	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryOne", "Query one character");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 1, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("Expected 'length' = 0");
		else if (buf[0] != '\0')
			result.fail("Expected null terminator at index 0");
	}

	{
		const tcu::ScopedLogSection section	(gl.getLog(), "QueryNone", "Query to zero-sized buffer");
		std::string					buf		(logLen + 2, 'X');
		int							written	= -1;

		(gl.*getInfoLog)(object, 0, &written, &buf[0]);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), getterName);

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("Expected 'length' = 0");
		else if (buf[0] != 'X')
			result.fail("Unexpected buffer mutation at index 0");
	}
}